

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

ushort prsxsst(prscxdef *ctx)

{
  char *in_RDI;
  
  if (*(ushort *)(in_RDI + 0xa0) < 2) {
    errsigf((errcxdef *)ctx,in_RDI,0);
  }
  *(int *)(in_RDI + 0x98) = (int)*(undefined8 *)(in_RDI + 0x90) - ((int)in_RDI + 0xd0);
  *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 2;
  *(short *)(in_RDI + 0xa0) = *(short *)(in_RDI + 0xa0) + -2;
  in_RDI[0x9c] = '\x02';
  in_RDI[0x9d] = '\0';
  return (ushort)*(undefined4 *)(in_RDI + 0x98);
}

Assistant:

ushort prsxsst(prscxdef *ctx)
{
    /* make sure there's space for the length prefix (a ushort) */
    if (ctx->prscxnrem < 2)
        errsig(ctx->prscxerr, ERR_NONODE);
    
    ctx->prscxsofs = ctx->prscxnode - &ctx->prscxpool[0];
    ctx->prscxnode += 2;
    ctx->prscxnrem -= 2;
    ctx->prscxslen = 2;
    return(ctx->prscxsofs);
}